

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::TestKeyOwner(ImGuiKey key,ImGuiID owner_id)

{
  bool bVar1;
  ImGuiKeyOwnerData *pIVar2;
  ImGuiID in_ESI;
  ImGuiKey in_EDI;
  ImGuiKeyOwnerData *owner_data;
  ImGuiContext *g;
  bool local_1;
  
  bVar1 = IsNamedKeyOrModKey(in_EDI);
  if (bVar1) {
    if (((((GImGui->ActiveIdUsingAllKeyboardKeys & 1U) == 0) || (in_ESI == GImGui->ActiveId)) ||
        (in_ESI == 0)) || (((int)in_EDI < 0x200 || (0x268 < (int)in_EDI)))) {
      pIVar2 = GetKeyOwnerData(ImGuiKey_KeysData_OFFSET);
      if (in_ESI == 0) {
        local_1 = (pIVar2->LockThisFrame & 1U) == 0;
      }
      else {
        if (pIVar2->OwnerCurr != in_ESI) {
          if ((pIVar2->LockThisFrame & 1U) != 0) {
            return false;
          }
          if (pIVar2->OwnerCurr != 0xffffffff) {
            return false;
          }
        }
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::TestKeyOwner(ImGuiKey key, ImGuiID owner_id)
{
    if (!IsNamedKeyOrModKey(key))
        return true;

    ImGuiContext& g = *GImGui;
    if (g.ActiveIdUsingAllKeyboardKeys && owner_id != g.ActiveId && owner_id != ImGuiKeyOwner_Any)
        if (key >= ImGuiKey_Keyboard_BEGIN && key < ImGuiKey_Keyboard_END)
            return false;

    ImGuiKeyOwnerData* owner_data = GetKeyOwnerData(key);
    if (owner_id == ImGuiKeyOwner_Any)
        return (owner_data->LockThisFrame == false);

    // Note: SetKeyOwner() sets OwnerCurr. It is not strictly required for most mouse routing overlap (because of ActiveId/HoveredId
    // are acting as filter before this has a chance to filter), but sane as soon as user tries to look into things.
    // Setting OwnerCurr in SetKeyOwner() is more consistent than testing OwnerNext here: would be inconsistent with getter and other functions.
    if (owner_data->OwnerCurr != owner_id)
    {
        if (owner_data->LockThisFrame)
            return false;
        if (owner_data->OwnerCurr != ImGuiKeyOwner_None)
            return false;
    }

    return true;
}